

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexBeginWrite(Fts5Index *p,int bDelete,i64 iRowid)

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  Fts5Index *in_RDI;
  undefined4 in_stack_00000008;
  
  if (in_RDI->pHash == (Fts5Hash *)0x0) {
    iVar1 = sqlite3Fts5HashNew((Fts5Config *)p,(Fts5Hash **)CONCAT44(bDelete,in_stack_00000008),
                               (int *)iRowid);
    in_RDI->rc = iVar1;
  }
  if ((in_RDX < in_RDI->iWriteRowid) ||
     (((in_RDX == in_RDI->iWriteRowid && (in_RDI->bDelete == 0)) ||
      (in_RDI->pConfig->nHashSize < in_RDI->nPendingData)))) {
    fts5IndexFlush((Fts5Index *)0x288921);
  }
  in_RDI->iWriteRowid = in_RDX;
  in_RDI->bDelete = in_ESI;
  if (in_ESI == 0) {
    in_RDI->nPendingRow = in_RDI->nPendingRow + 1;
  }
  iVar1 = fts5IndexReturn(in_RDI);
  return iVar1;
}

Assistant:

static int sqlite3Fts5IndexBeginWrite(Fts5Index *p, int bDelete, i64 iRowid){
  assert( p->rc==SQLITE_OK );

  /* Allocate the hash table if it has not already been allocated */
  if( p->pHash==0 ){
    p->rc = sqlite3Fts5HashNew(p->pConfig, &p->pHash, &p->nPendingData);
  }

  /* Flush the hash table to disk if required */
  if( iRowid<p->iWriteRowid
   || (iRowid==p->iWriteRowid && p->bDelete==0)
   || (p->nPendingData > p->pConfig->nHashSize)
  ){
    fts5IndexFlush(p);
  }

  p->iWriteRowid = iRowid;
  p->bDelete = bDelete;
  if( bDelete==0 ){
    p->nPendingRow++;
  }
  return fts5IndexReturn(p);
}